

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSReportedWaypointAltitude.c
# Opt level: O0

void FANSReportedWaypointAltitude_1_inherit_TYPE_descriptor(asn_TYPE_descriptor_t *td)

{
  asn_TYPE_descriptor_t *td_local;
  
  td->free_struct = asn_DEF_FANSAltitude.free_struct;
  td->print_struct = asn_DEF_FANSAltitude.print_struct;
  td->check_constraints = asn_DEF_FANSAltitude.check_constraints;
  td->ber_decoder = asn_DEF_FANSAltitude.ber_decoder;
  td->der_encoder = asn_DEF_FANSAltitude.der_encoder;
  td->xer_decoder = asn_DEF_FANSAltitude.xer_decoder;
  td->xer_encoder = asn_DEF_FANSAltitude.xer_encoder;
  td->uper_decoder = asn_DEF_FANSAltitude.uper_decoder;
  td->uper_encoder = asn_DEF_FANSAltitude.uper_encoder;
  if (td->per_constraints == (asn_per_constraints_t *)0x0) {
    td->per_constraints = asn_DEF_FANSAltitude.per_constraints;
  }
  td->elements = asn_DEF_FANSAltitude.elements;
  td->elements_count = asn_DEF_FANSAltitude.elements_count;
  td->specifics = asn_DEF_FANSAltitude.specifics;
  return;
}

Assistant:

static void
FANSReportedWaypointAltitude_1_inherit_TYPE_descriptor(asn_TYPE_descriptor_t *td) {
	td->free_struct    = asn_DEF_FANSAltitude.free_struct;
	td->print_struct   = asn_DEF_FANSAltitude.print_struct;
	td->check_constraints = asn_DEF_FANSAltitude.check_constraints;
	td->ber_decoder    = asn_DEF_FANSAltitude.ber_decoder;
	td->der_encoder    = asn_DEF_FANSAltitude.der_encoder;
	td->xer_decoder    = asn_DEF_FANSAltitude.xer_decoder;
	td->xer_encoder    = asn_DEF_FANSAltitude.xer_encoder;
	td->uper_decoder   = asn_DEF_FANSAltitude.uper_decoder;
	td->uper_encoder   = asn_DEF_FANSAltitude.uper_encoder;
	if(!td->per_constraints)
		td->per_constraints = asn_DEF_FANSAltitude.per_constraints;
	td->elements       = asn_DEF_FANSAltitude.elements;
	td->elements_count = asn_DEF_FANSAltitude.elements_count;
	td->specifics      = asn_DEF_FANSAltitude.specifics;
}